

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

void lj_ir_kvalue(lua_State *L,TValue *tv,IRIns *ir)

{
  byte bVar1;
  void *pvVar2;
  lua_State *in_RDX;
  double *in_RSI;
  GCcdata *cd;
  GCcdata *cd_1;
  undefined8 in_stack_ffffffffffffff48;
  
  switch(in_RDX->gct) {
  case '\x15':
    *(uint *)((long)in_RSI + 4) = in_RDX->marked & 0x1f ^ 0xffffffff;
    break;
  case '\x16':
    *in_RSI = (double)(int)(in_RDX->nextgc).gcptr32;
    break;
  case '\x17':
    bVar1 = in_RDX->marked;
    *(uint32_t *)in_RSI = (in_RDX->nextgc).gcptr32;
    *(uint *)((long)in_RSI + 4) = bVar1 & 0x1f ^ 0xffffffff;
    break;
  case '\x18':
  case '\x19':
  case '\x1a':
    *in_RSI = (double)((ulong)(in_RDX->nextgc).gcptr32 | 0xffff000000000000);
    break;
  case '\x1b':
    *in_RSI = *(double *)(ulong)(in_RDX->nextgc).gcptr32;
    break;
  case '\x1c':
    pvVar2 = lj_mem_newgco(in_RDX,(MSize)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    *(undefined1 *)((long)pvVar2 + 5) = 10;
    *(undefined2 *)((long)pvVar2 + 6) = 0xb;
    *(undefined8 *)((long)pvVar2 + 8) = *(undefined8 *)(ulong)(in_RDX->nextgc).gcptr32;
    *(int *)in_RSI = (int)pvVar2;
    *(undefined4 *)((long)in_RSI + 4) = 0xfffffff5;
  }
  return;
}

Assistant:

void lj_ir_kvalue(lua_State *L, TValue *tv, const IRIns *ir)
{
  UNUSED(L);
  lua_assert(ir->o != IR_KSLOT);  /* Common mistake. */
  switch (ir->o) {
  case IR_KPRI: setitype(tv, irt_toitype(ir->t)); break;
  case IR_KINT: setintV(tv, ir->i); break;
  case IR_KGC: setgcV(L, tv, ir_kgc(ir), irt_toitype(ir->t)); break;
  case IR_KPTR: case IR_KKPTR: case IR_KNULL:
    setlightudV(tv, mref(ir->ptr, void));
    break;
  case IR_KNUM: setnumV(tv, ir_knum(ir)->n); break;
#if LJ_HASFFI
  case IR_KINT64: {
    GCcdata *cd = lj_cdata_new_(L, CTID_INT64, 8);
    *(uint64_t *)cdataptr(cd) = ir_kint64(ir)->u64;
    setcdataV(L, tv, cd);
    break;
    }
#endif
  default: lua_assert(0); break;
  }
}